

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O0

void __thiscall
myEmployeeCustomConstructor::ArchiveIN(myEmployeeCustomConstructor *this,ChArchiveIn *marchive)

{
  ChArchiveIn *this_00;
  ChNameValue<int> local_30;
  ChArchiveIn *local_18;
  ChArchiveIn *marchive_local;
  myEmployeeCustomConstructor *this_local;
  
  local_18 = marchive;
  marchive_local = (ChArchiveIn *)this;
  chrono::ChArchiveIn::VersionRead<myEmployeeCustomConstructor>(marchive);
  myEmployee::ArchiveIN(&this->super_myEmployee,local_18);
  this_00 = local_18;
  chrono::make_ChNameValue<int>(&local_30,"legs",&this->legs,'\0');
  chrono::ChArchiveIn::operator>>(this_00,&local_30);
  chrono::ChNameValue<int>::~ChNameValue(&local_30);
  return;
}

Assistant:

virtual void ArchiveIN(ChArchiveIn& marchive)  //##### for Chrono serialization
    {
        // suggested: use versioning
        /*int version =*/ marchive.VersionRead<myEmployeeCustomConstructor>();
        // remember to deserialize the parent class data too!!!
        myEmployee::ArchiveIN(marchive);
        // stream in member data (except data used in constructor, already saved in ArchiveOUTconstructor)
        marchive >> CHNVP(legs);
    }